

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrExp.c
# Opt level: O2

void Rwt_Man4ExploreStart(void)

{
  Rwr_Man4_t *pRVar1;
  int *piVar2;
  
  pRVar1 = (Rwr_Man4_t *)calloc(1,0x20);
  pRVar1->nFuncs = 0x10000;
  Extra_Truth4VarNPN(&pRVar1->puCanons,(char **)0x0,(char **)0x0,(uchar **)0x0);
  piVar2 = (int *)calloc(1,(long)pRVar1->nFuncs << 2);
  pRVar1->pnCounts = piVar2;
  s_pManRwrExp4 = pRVar1;
  return;
}

Assistant:

void Rwt_Man4ExploreStart()
{
    Rwr_Man4_t * p;
    p = ABC_ALLOC( Rwr_Man4_t, 1 );
    memset( p, 0, sizeof(Rwr_Man4_t) );
    // canonical forms
    p->nFuncs    = (1<<16);
    // canonical forms, phases, perms
    Extra_Truth4VarNPN( &p->puCanons, NULL, NULL, NULL );
    // counters
    p->pnCounts  = ABC_ALLOC( int, p->nFuncs );
    memset( p->pnCounts, 0, sizeof(int) * p->nFuncs );
    s_pManRwrExp4 = p;
}